

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

void __thiscall server_queue::cleanup_pending_task(server_queue *this,int id_target)

{
  _Deque_iterator<server_task,_server_task_&,_server_task_*> local_168;
  iterator local_148;
  const_iterator local_128;
  _Deque_iterator<server_task,_server_task_&,_server_task_*> local_108;
  _Deque_iterator<server_task,_server_task_&,_server_task_*> local_e8;
  const_iterator local_c8;
  const_iterator local_a8;
  _Deque_iterator<server_task,_server_task_&,_server_task_*> local_88;
  _Deque_iterator<server_task,_server_task_&,_server_task_*> local_68;
  const_iterator local_48;
  
  local_68._M_cur =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_68._M_first =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_68._M_last =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_68._M_node =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  local_88._M_cur =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_88._M_first =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_88._M_last =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_88._M_node =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  std::
  remove_if<std::_Deque_iterator<server_task,server_task&,server_task*>,server_queue::cleanup_pending_task(int)::_lambda(server_task_const&)_1_>
            (&local_168,&local_68,&local_88,(anon_class_4_1_e68e03d5_for__M_pred)id_target);
  local_48._M_cur = local_168._M_cur;
  local_48._M_first = local_168._M_first;
  local_48._M_last = local_168._M_last;
  local_48._M_node = local_168._M_node;
  local_a8._M_cur =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur;
  local_a8._M_first =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_finish._M_first;
  local_a8._M_last =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_finish._M_last;
  local_a8._M_node =
       (this->queue_tasks).super__Deque_base<server_task,_std::allocator<server_task>_>._M_impl.
       super__Deque_impl_data._M_finish._M_node;
  httplib::detail::std::deque<server_task,_std::allocator<server_task>_>::erase
            (&local_148,&this->queue_tasks,&local_48,&local_a8);
  local_e8._M_cur =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_start._M_cur;
  local_e8._M_first =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_start._M_first;
  local_e8._M_last =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_start._M_last;
  local_e8._M_node =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_start._M_node;
  local_108._M_cur =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_108._M_first =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_first;
  local_108._M_last =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_last;
  local_108._M_node =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_node;
  std::
  remove_if<std::_Deque_iterator<server_task,server_task&,server_task*>,server_queue::cleanup_pending_task(int)::_lambda(server_task_const&)_1_>
            (&local_168,&local_e8,&local_108,(anon_class_4_1_e68e03d5_for__M_pred)id_target);
  local_c8._M_cur = local_168._M_cur;
  local_c8._M_first = local_168._M_first;
  local_c8._M_last = local_168._M_last;
  local_c8._M_node = local_168._M_node;
  local_128._M_cur =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_cur;
  local_128._M_first =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_first;
  local_128._M_last =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_last;
  local_128._M_node =
       (this->queue_tasks_deferred).super__Deque_base<server_task,_std::allocator<server_task>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_node;
  httplib::detail::std::deque<server_task,_std::allocator<server_task>_>::erase
            (&local_148,&this->queue_tasks_deferred,&local_c8,&local_128);
  return;
}

Assistant:

void cleanup_pending_task(int id_target) {
        // no need lock because this is called exclusively by post()
        auto rm_func = [id_target](const server_task & task) {
            return task.id_target == id_target;
        };
        queue_tasks.erase(
            std::remove_if(queue_tasks.begin(),          queue_tasks.end(),          rm_func),
            queue_tasks.end());
        queue_tasks_deferred.erase(
            std::remove_if(queue_tasks_deferred.begin(), queue_tasks_deferred.end(), rm_func),
            queue_tasks_deferred.end());
    }